

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_window_quantiles.cc
# Opt level: O0

void __thiscall
prometheus::detail::TimeWindowQuantiles::insert(TimeWindowQuantiles *this,double value)

{
  bool bVar1;
  reference this_00;
  CKMSQuantiles *bucket;
  iterator __end2;
  iterator __begin2;
  vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
  *__range2;
  double value_local;
  TimeWindowQuantiles *this_local;
  
  rotate(this);
  __end2 = std::
           vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
           ::begin(&this->ckms_quantiles_);
  bucket = (CKMSQuantiles *)
           std::
           vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
           ::end(&this->ckms_quantiles_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<prometheus::detail::CKMSQuantiles_*,_std::vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>_>
                                *)&bucket);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<prometheus::detail::CKMSQuantiles_*,_std::vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>_>
              ::operator*(&__end2);
    CKMSQuantiles::insert(this_00,value);
    __gnu_cxx::
    __normal_iterator<prometheus::detail::CKMSQuantiles_*,_std::vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void TimeWindowQuantiles::insert(double value) {
  rotate();
  for (auto& bucket : ckms_quantiles_) {
    bucket.insert(value);
  }
}